

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O0

void __thiscall OpenMD::SC::SC(SC *this)

{
  undefined8 *in_RDI;
  allocator<char> *unaff_retaddr;
  char *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  MetallicInteraction *in_stack_ffffffffffffffd0;
  allocator<char> local_9 [9];
  
  MetallicInteraction::MetallicInteraction(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__SC_00501398;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::allocator<char>::~allocator(local_9);
  *(undefined1 *)(in_RDI + 5) = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2f4940);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2f494d);
  std::vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>::vector
            ((vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_> *)0x2f495a);
  std::
  vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
  ::vector((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
            *)0x2f496a);
  in_RDI[0x16] = 0;
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x2f4985);
  *(undefined4 *)(in_RDI + 0x1d) = 3000;
  return;
}

Assistant:

SC::SC() : name_("SC"), initialized_(false), forceField_(NULL), np_(3000) {}